

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigMffc.c
# Opt level: O2

int Aig_NodeRefLabel_rec(Aig_Man_t *p,Aig_Obj_t *pNode,uint LevelMin)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  Aig_Obj_t *pAVar5;
  
  iVar2 = 0;
  if ((*(uint *)&pNode->field_0x18 & 7) != 2) {
    pNode->TravId = p->nTravIds;
    pAVar5 = (Aig_Obj_t *)((ulong)pNode->pFanin0 & 0xfffffffffffffffe);
    uVar1 = *(ulong *)&pAVar5->field_0x18;
    *(ulong *)&pAVar5->field_0x18 =
         uVar1 & 0xffffffff0000003f | (ulong)((int)uVar1 + 0x40U & 0xffffffc0);
    iVar2 = 0;
    if (((uVar1 & 0xffffffc0) == 0) &&
       ((LevelMin == 0 || (iVar2 = 0, LevelMin < ((uint)(uVar1 >> 0x20) & 0xffffff))))) {
      iVar2 = Aig_NodeRefLabel_rec(p,pAVar5,LevelMin);
    }
    uVar3 = (uint)*(undefined8 *)&pNode->field_0x18;
    if ((uVar3 & 7) != 4) {
      if ((uVar3 & 7) - 7 < 0xfffffffe) {
        __assert_fail("Aig_ObjIsNode(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigMffc.c"
                      ,0x83,"int Aig_NodeRefLabel_rec(Aig_Man_t *, Aig_Obj_t *, unsigned int)");
      }
      pAVar5 = (Aig_Obj_t *)((ulong)pNode->pFanin1 & 0xfffffffffffffffe);
      uVar1 = *(ulong *)&pAVar5->field_0x18;
      *(ulong *)&pAVar5->field_0x18 =
           uVar1 & 0xffffffff0000003f | (ulong)((int)uVar1 + 0x40U & 0xffffffc0);
      if (((uVar1 & 0xffffffc0) == 0) &&
         ((LevelMin == 0 || (LevelMin < ((uint)(uVar1 >> 0x20) & 0xffffff))))) {
        iVar4 = Aig_NodeRefLabel_rec(p,pAVar5,LevelMin);
        iVar2 = iVar2 + iVar4;
      }
      iVar2 = iVar2 + 1;
    }
  }
  return iVar2;
}

Assistant:

int Aig_NodeRefLabel_rec( Aig_Man_t * p, Aig_Obj_t * pNode, unsigned LevelMin )
{
    Aig_Obj_t * pFanin;
    int Counter = 0;
    if ( Aig_ObjIsCi(pNode) )
        return 0;
    Aig_ObjSetTravIdCurrent( p, pNode );
    // consider the first fanin
    pFanin = Aig_ObjFanin0(pNode);
    if ( pFanin->nRefs++ == 0 && (!LevelMin || pFanin->Level > LevelMin) )
        Counter += Aig_NodeRefLabel_rec( p, pFanin, LevelMin );
    if ( Aig_ObjIsBuf(pNode) )
        return Counter;
    assert( Aig_ObjIsNode(pNode) );
    // consider the second fanin
    pFanin = Aig_ObjFanin1(pNode);
    if ( pFanin->nRefs++ == 0 && (!LevelMin || pFanin->Level > LevelMin) )
        Counter += Aig_NodeRefLabel_rec( p, pFanin, LevelMin );
    return Counter + 1;
}